

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

int32_t charIterTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                           UErrorCode *status)

{
  long *plVar1;
  uint uVar2;
  int64_t iVar3;
  int iVar4;
  int iVar5;
  int length;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_4c;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < destCapacity) {
      if ((start <= limit) && (dest != (UChar *)0x0 || destCapacity == 0)) {
        lVar8 = (long)(int)ut->a;
        iVar3 = start;
        if (lVar8 < start) {
          iVar3 = lVar8;
        }
        length = 0;
        iVar5 = (int)iVar3;
        if (start < 0) {
          iVar5 = 0;
        }
        if (limit <= lVar8) {
          lVar8 = limit;
        }
        iVar7 = (int)lVar8;
        if (limit < 0) {
          iVar7 = 0;
        }
        plVar1 = (long *)ut->context;
        (**(code **)(*plVar1 + 0x80))(plVar1,iVar5);
        iVar5 = *(int *)((long)plVar1 + 0xc);
        local_4c = iVar5;
        if (iVar5 < iVar7) {
          length = 0;
          do {
            uVar2 = (**(code **)(*plVar1 + 0x30))(plVar1);
            iVar4 = 2 - (uint)(uVar2 < 0x10000);
            if (destCapacity < iVar4 + length) {
              *status = U_BUFFER_OVERFLOW_ERROR;
              length = iVar4 + length;
            }
            else {
              if (uVar2 < 0x10000) {
                iVar6 = length + 1;
                dest[length] = (UChar)uVar2;
              }
              else {
                dest[length] = (short)(uVar2 >> 10) + L'ퟀ';
                iVar6 = length + 2;
                dest[(long)length + 1] = (UChar)uVar2 & 0x3ffU | 0xdc00;
              }
              local_4c = iVar4 + iVar5;
              length = iVar6;
            }
            iVar5 = iVar4 + iVar5;
          } while (iVar5 < iVar7);
        }
        charIterTextAccess(ut,(long)local_4c,'\x01');
        u_terminateUChars_63(dest,destCapacity,length,status);
        return length;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

static int32_t U_CALLCONV
charIterTextExtract(UText *ut,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *status)
{
    if(U_FAILURE(*status)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0) || start>limit) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t  length  = (int32_t)ut->a;
    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);
    int32_t  desti   = 0;
    int32_t  srci;
    int32_t  copyLimit;

    CharacterIterator *ci = (CharacterIterator *)ut->context;
    ci->setIndex32(start32);   // Moves ix to lead of surrogate pair, if needed.
    srci = ci->getIndex();
    copyLimit = srci;
    while (srci<limit32) {
        UChar32 c = ci->next32PostInc();
        int32_t  len = U16_LENGTH(c);
        U_ASSERT(desti+len>0); /* to ensure desti+len never exceeds MAX_INT32, which must not happen logically */
        if (desti+len <= destCapacity) {
            U16_APPEND_UNSAFE(dest, desti, c);
            copyLimit = srci+len;
        } else {
            desti += len;
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
        srci += len;
    }

    charIterTextAccess(ut, copyLimit, TRUE);

    u_terminateUChars(dest, destCapacity, desti, status);
    return desti;
}